

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O3

string_type * __thiscall
toml::detail::serializer<toml::type_config>::operator()[abi_cxx11_
          (string_type *__return_storage_ptr__,serializer<toml::type_config> *this,value_type *v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  integer_type i;
  string_type *psVar3;
  string_format_info *fmt;
  array_type *a;
  array_format_info *fmt_00;
  integer_type *piVar4;
  integer_format_info *fmt_01;
  floating_type *pfVar5;
  floating_format_info *fmt_02;
  local_date_type *d;
  local_date_format_info *plVar6;
  boolean_type *b;
  boolean_format_info *pbVar7;
  offset_datetime_type *odt;
  offset_datetime_format_info *fmt_03;
  local_datetime_type *dt;
  local_datetime_format_info *fmt_04;
  table_format_info *ptVar8;
  table_type *t;
  local_time_type *t_00;
  local_time_format_info *plVar9;
  undefined8 *puVar10;
  undefined1 local_240 [120];
  string local_1c8;
  floating_type local_1a8;
  string local_1a0;
  string_type local_180;
  string_type local_160;
  string local_140;
  source_location local_120;
  source_location local_a8;
  
  switch(v->type_) {
  case empty:
    if ((this->spec_).ext_null_value == true) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"null","");
      return __return_storage_ptr__;
    }
  default:
    puVar10 = (undefined8 *)__cxa_allocate_exception(0xa0);
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1a0,
               "[error] toml::serializer: toml::basic_value does not have any valid type.","");
    source_location::source_location(&local_a8,&v->region_);
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"here","");
    format_error<>(&local_1c8,&local_1a0,&local_a8,&local_140);
    source_location::source_location(&local_120,&v->region_);
    *puVar10 = &PTR__serialization_error_004d0978;
    puVar10[1] = puVar10 + 3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p == &local_1c8.field_2) {
      puVar10[3] = CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                            local_1c8.field_2._M_local_buf[0]);
      puVar10[4] = local_1c8.field_2._8_8_;
    }
    else {
      puVar10[1] = local_1c8._M_dataplus._M_p;
      puVar10[3] = CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                            local_1c8.field_2._M_local_buf[0]);
    }
    puVar10[2] = local_1c8._M_string_length;
    local_1c8._M_string_length = 0;
    local_1c8.field_2._M_local_buf[0] = '\0';
    paVar1 = &local_120.file_name_.field_2;
    *(undefined4 *)(puVar10 + 0xb) = (undefined4)local_120.last_offset_;
    *(undefined4 *)((long)puVar10 + 0x5c) = local_120.last_offset_._4_4_;
    *(undefined4 *)(puVar10 + 0xc) = (undefined4)local_120.length_;
    *(undefined4 *)((long)puVar10 + 100) = local_120.length_._4_4_;
    *(undefined4 *)(puVar10 + 9) = (undefined4)local_120.last_line_;
    *(undefined4 *)((long)puVar10 + 0x4c) = local_120.last_line_._4_4_;
    *(undefined4 *)(puVar10 + 10) = (undefined4)local_120.last_column_;
    *(undefined4 *)((long)puVar10 + 0x54) = local_120.last_column_._4_4_;
    *(undefined4 *)(puVar10 + 7) = (undefined4)local_120.first_column_;
    *(undefined4 *)((long)puVar10 + 0x3c) = local_120.first_column_._4_4_;
    *(undefined4 *)(puVar10 + 8) = (undefined4)local_120.first_offset_;
    *(undefined4 *)((long)puVar10 + 0x44) = local_120.first_offset_._4_4_;
    puVar10[5] = local_120._0_8_;
    puVar10[6] = local_120.first_line_;
    puVar10[0xd] = puVar10 + 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120.file_name_._M_dataplus._M_p == paVar1) {
      puVar10[0xf] = CONCAT71(local_120.file_name_.field_2._M_allocated_capacity._1_7_,
                              local_120.file_name_.field_2._M_local_buf[0]);
      puVar10[0x10] = local_120.file_name_.field_2._8_8_;
    }
    else {
      puVar10[0xd] = local_120.file_name_._M_dataplus._M_p;
      puVar10[0xf] = CONCAT71(local_120.file_name_.field_2._M_allocated_capacity._1_7_,
                              local_120.file_name_.field_2._M_local_buf[0]);
    }
    puVar10[0xe] = local_120.file_name_._M_string_length;
    local_120.file_name_._M_string_length = 0;
    local_120.file_name_.field_2._M_local_buf[0] = '\0';
    puVar10[0x11] =
         local_120.line_str_.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    puVar10[0x12] =
         local_120.line_str_.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    puVar10[0x13] =
         local_120.line_str_.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_120.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_120.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_120.line_str_.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    local_120.file_name_._M_dataplus._M_p = (pointer)paVar1;
    __cxa_throw(puVar10,&serialization_error::typeinfo,serialization_error::~serialization_error);
  case boolean:
    b = basic_value<toml::type_config>::as_boolean(v);
    pbVar7 = basic_value<toml::type_config>::as_boolean_fmt(v);
    source_location::source_location((source_location *)local_240,&v->region_);
    operator()[abi_cxx11_(__return_storage_ptr__,this,b,pbVar7,(source_location *)local_240);
    break;
  case integer:
    piVar4 = basic_value<toml::type_config>::as_integer(v);
    i = *piVar4;
    fmt_01 = basic_value<toml::type_config>::as_integer_fmt(v);
    source_location::source_location((source_location *)local_240,&v->region_);
    operator()[abi_cxx11_(__return_storage_ptr__,this,i,fmt_01,(source_location *)local_240);
    break;
  case floating:
    pfVar5 = basic_value<toml::type_config>::as_floating(v);
    local_1a8 = *pfVar5;
    fmt_02 = basic_value<toml::type_config>::as_floating_fmt(v);
    source_location::source_location((source_location *)local_240,&v->region_);
    operator()[abi_cxx11_(__return_storage_ptr__,this,local_1a8,fmt_02,(source_location *)local_240)
    ;
    break;
  case string:
    psVar3 = basic_value<toml::type_config>::as_string_abi_cxx11_(v);
    pcVar2 = (psVar3->_M_dataplus)._M_p;
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_160,pcVar2,pcVar2 + psVar3->_M_string_length);
    fmt = basic_value<toml::type_config>::as_string_fmt(v);
    source_location::source_location((source_location *)local_240,&v->region_);
    operator()(__return_storage_ptr__,this,&local_160,fmt,(source_location *)local_240);
    source_location::~source_location((source_location *)local_240);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p == &local_160.field_2) {
      return __return_storage_ptr__;
    }
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    return __return_storage_ptr__;
  case offset_datetime:
    odt = basic_value<toml::type_config>::as_offset_datetime(v);
    fmt_03 = basic_value<toml::type_config>::as_offset_datetime_fmt(v);
    source_location::source_location((source_location *)local_240,&v->region_);
    operator()[abi_cxx11_(__return_storage_ptr__,this,odt,fmt_03,(source_location *)local_240);
    break;
  case local_datetime:
    dt = basic_value<toml::type_config>::as_local_datetime(v);
    fmt_04 = basic_value<toml::type_config>::as_local_datetime_fmt(v);
    source_location::source_location((source_location *)local_240,&v->region_);
    operator()[abi_cxx11_(__return_storage_ptr__,this,dt,fmt_04,(source_location *)local_240);
    break;
  case local_date:
    d = basic_value<toml::type_config>::as_local_date(v);
    plVar6 = basic_value<toml::type_config>::as_local_date_fmt(v);
    source_location::source_location((source_location *)local_240,&v->region_);
    operator()[abi_cxx11_(__return_storage_ptr__,this,d,plVar6,(source_location *)local_240);
    break;
  case local_time:
    t_00 = basic_value<toml::type_config>::as_local_time(v);
    plVar9 = basic_value<toml::type_config>::as_local_time_fmt(v);
    source_location::source_location((source_location *)local_240,&v->region_);
    format_local_time_abi_cxx11_
              (__return_storage_ptr__,this,t_00,plVar9->has_seconds,plVar9->subsecond_precision);
    break;
  case array:
    a = basic_value<toml::type_config>::as_array(v);
    fmt_00 = basic_value<toml::type_config>::as_array_fmt(v);
    source_location::source_location((source_location *)local_240,&v->region_);
    operator()[abi_cxx11_
              (__return_storage_ptr__,this,a,fmt_00,&v->comments_,(source_location *)local_240);
    break;
  case table:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if ((this->keys_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->keys_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ptVar8 = basic_value<toml::type_config>::as_table_fmt(v);
      format_comments_abi_cxx11_((string_type *)local_240,this,&v->comments_,ptVar8->indent_type);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__,(char *)local_240._0_8_,local_240._8_8_);
      if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
        operator_delete((void *)local_240._0_8_,local_240._16_8_ + 1);
      }
      if (__return_storage_ptr__->_M_string_length != 0) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __return_storage_ptr__,'\n');
      }
    }
    t = basic_value<toml::type_config>::as_table_abi_cxx11_(v);
    ptVar8 = basic_value<toml::type_config>::as_table_fmt(v);
    source_location::source_location((source_location *)local_240,&v->region_);
    operator()(&local_180,this,t,ptVar8,&v->comments_,(source_location *)local_240);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,local_180._M_dataplus._M_p,local_180._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
  }
  source_location::~source_location((source_location *)local_240);
  return __return_storage_ptr__;
}

Assistant:

string_type operator()(const value_type& v)
    {
        switch(v.type())
        {
            case value_t::boolean        : {return (*this)(v.as_boolean        (), v.as_boolean_fmt        (), v.location());}
            case value_t::integer        : {return (*this)(v.as_integer        (), v.as_integer_fmt        (), v.location());}
            case value_t::floating       : {return (*this)(v.as_floating       (), v.as_floating_fmt       (), v.location());}
            case value_t::string         : {return (*this)(v.as_string         (), v.as_string_fmt         (), v.location());}
            case value_t::offset_datetime: {return (*this)(v.as_offset_datetime(), v.as_offset_datetime_fmt(), v.location());}
            case value_t::local_datetime : {return (*this)(v.as_local_datetime (), v.as_local_datetime_fmt (), v.location());}
            case value_t::local_date     : {return (*this)(v.as_local_date     (), v.as_local_date_fmt     (), v.location());}
            case value_t::local_time     : {return (*this)(v.as_local_time     (), v.as_local_time_fmt     (), v.location());}
            case value_t::array          :
            {
                return (*this)(v.as_array(), v.as_array_fmt(), v.comments(), v.location());
            }
            case value_t::table          :
            {
                string_type retval;
                if(this->keys_.empty()) // it might be the root table. emit comments here.
                {
                    retval += format_comments(v.comments(), v.as_table_fmt().indent_type);
                }
                if( ! retval.empty()) // we have comment.
                {
                    retval += char_type('\n');
                }

                retval += (*this)(v.as_table(), v.as_table_fmt(), v.comments(), v.location());
                return retval;
            }
            case value_t::empty:
            {
                if(this->spec_.ext_null_value)
                {
                    return string_conv<string_type>("null");
                }
                break;
            }
            default:
            {
                break;
            }
        }
        throw serialization_error(format_error(
            "[error] toml::serializer: toml::basic_value "
            "does not have any valid type.", v.location(), "here"), v.location());
    }